

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_restore_layer_context(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  AV1_PRIMARY *pAVar9;
  CYCLIC_REFRESH *pCVar10;
  _Bool _Var11;
  LAYER_CONTEXT *__src;
  AV1_COMP *in_RDI;
  CYCLIC_REFRESH *cr;
  int static_since_last_scene_change;
  int postencode_drop;
  int max_consec_drop;
  int last_target_size_keyframe;
  int last_encoded_size_keyframe;
  int frames_since_scene_change;
  int old_frame_to_key;
  int old_frame_since_key;
  LAYER_CONTEXT *lc;
  AV1_COMMON *cm;
  RTC_REF *rtc_ref;
  SVC *svc;
  int local_54;
  
  pAVar9 = in_RDI->ppi;
  __src = get_layer_context(in_RDI);
  iVar1 = (in_RDI->rc).frames_since_key;
  iVar2 = (in_RDI->rc).frames_to_key;
  iVar3 = (in_RDI->rc).frames_since_scene_change;
  iVar4 = (in_RDI->rc).last_encoded_size_keyframe;
  iVar5 = (in_RDI->rc).last_target_size_keyframe;
  iVar6 = (in_RDI->rc).max_consec_drop;
  iVar7 = (in_RDI->rc).postencode_drop;
  iVar8 = (in_RDI->rc).static_since_last_scene_change;
  memcpy(&in_RDI->rc,__src,0x140);
  memcpy(&in_RDI->ppi->p_rc,&__src->p_rc,0x31d8);
  (in_RDI->oxcf).rc_cfg.target_bandwidth = __src->target_bandwidth;
  in_RDI->gf_frame_index = '\0';
  (in_RDI->mv_search_params).max_mv_magnitude = __src->max_mv_magnitude;
  if ((in_RDI->mv_search_params).max_mv_magnitude == 0) {
    if ((in_RDI->common).height < (in_RDI->common).width) {
      local_54 = (in_RDI->common).width;
    }
    else {
      local_54 = (in_RDI->common).height;
    }
    (in_RDI->mv_search_params).max_mv_magnitude = local_54;
  }
  (in_RDI->rc).frames_since_key = iVar1;
  (in_RDI->rc).frames_to_key = iVar2;
  (in_RDI->rc).frames_since_scene_change = iVar3;
  (in_RDI->rc).last_encoded_size_keyframe = iVar4;
  (in_RDI->rc).last_target_size_keyframe = iVar5;
  (in_RDI->rc).max_consec_drop = iVar6;
  (in_RDI->rc).postencode_drop = iVar7;
  (in_RDI->rc).static_since_last_scene_change = iVar8;
  if ((((in_RDI->oxcf).q_cfg.aq_mode == '\x03') && (1 < (in_RDI->svc).number_spatial_layers)) &&
     ((in_RDI->svc).temporal_layer_id == 0)) {
    pCVar10 = in_RDI->cyclic_refresh;
    swap_ptr(&pCVar10->map,&__src->map);
    pCVar10->sb_index = __src->sb_index;
    pCVar10->actual_num_seg1_blocks = __src->actual_num_seg1_blocks;
    pCVar10->actual_num_seg2_blocks = __src->actual_num_seg2_blocks;
    pCVar10->counter_encode_maxq_scene_change = __src->counter_encode_maxq_scene_change;
  }
  (in_RDI->svc).skip_mvsearch_last = 0;
  (in_RDI->svc).skip_mvsearch_gf = 0;
  (in_RDI->svc).skip_mvsearch_altref = 0;
  if ((((pAVar9->rtc_ref).set_ref_frame_config != 0) &&
      ((in_RDI->svc).force_zero_mode_spatial_ref != 0)) &&
     ((in_RDI->sf).rt_sf.use_nonrd_pick_mode != 0)) {
    _Var11 = av1_check_ref_is_low_spatial_res_super_frame(in_RDI,1);
    if (_Var11) {
      (in_RDI->svc).skip_mvsearch_last = 1;
    }
    _Var11 = av1_check_ref_is_low_spatial_res_super_frame(in_RDI,4);
    if (_Var11) {
      (in_RDI->svc).skip_mvsearch_gf = 1;
    }
    _Var11 = av1_check_ref_is_low_spatial_res_super_frame(in_RDI,7);
    if (_Var11) {
      (in_RDI->svc).skip_mvsearch_altref = 1;
    }
  }
  return;
}

Assistant:

void av1_restore_layer_context(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  const AV1_COMMON *const cm = &cpi->common;
  LAYER_CONTEXT *const lc = get_layer_context(cpi);
  const int old_frame_since_key = cpi->rc.frames_since_key;
  const int old_frame_to_key = cpi->rc.frames_to_key;
  const int frames_since_scene_change = cpi->rc.frames_since_scene_change;
  const int last_encoded_size_keyframe = cpi->rc.last_encoded_size_keyframe;
  const int last_target_size_keyframe = cpi->rc.last_target_size_keyframe;
  const int max_consec_drop = cpi->rc.max_consec_drop;
  const int postencode_drop = cpi->rc.postencode_drop;
  const int static_since_last_scene_change =
      cpi->rc.static_since_last_scene_change;
  // Restore layer rate control.
  cpi->rc = lc->rc;
  cpi->ppi->p_rc = lc->p_rc;
  cpi->oxcf.rc_cfg.target_bandwidth = lc->target_bandwidth;
  cpi->gf_frame_index = 0;
  cpi->mv_search_params.max_mv_magnitude = lc->max_mv_magnitude;
  if (cpi->mv_search_params.max_mv_magnitude == 0)
    cpi->mv_search_params.max_mv_magnitude = AOMMAX(cm->width, cm->height);
  // Reset the following parameters to their values before
  // the layer restore. Keep these defined for the stream (not layer).
  cpi->rc.frames_since_key = old_frame_since_key;
  cpi->rc.frames_to_key = old_frame_to_key;
  cpi->rc.frames_since_scene_change = frames_since_scene_change;
  cpi->rc.last_encoded_size_keyframe = last_encoded_size_keyframe;
  cpi->rc.last_target_size_keyframe = last_target_size_keyframe;
  cpi->rc.max_consec_drop = max_consec_drop;
  cpi->rc.postencode_drop = postencode_drop;
  cpi->rc.static_since_last_scene_change = static_since_last_scene_change;
  // For spatial-svc, allow cyclic-refresh to be applied on the spatial layers,
  // for the base temporal layer.
  if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
      svc->number_spatial_layers > 1 && svc->temporal_layer_id == 0) {
    CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
    swap_ptr(&cr->map, &lc->map);
    cr->sb_index = lc->sb_index;
    cr->actual_num_seg1_blocks = lc->actual_num_seg1_blocks;
    cr->actual_num_seg2_blocks = lc->actual_num_seg2_blocks;
    cr->counter_encode_maxq_scene_change = lc->counter_encode_maxq_scene_change;
  }
  svc->skip_mvsearch_last = 0;
  svc->skip_mvsearch_gf = 0;
  svc->skip_mvsearch_altref = 0;
  // For each reference (LAST/GOLDEN) set the skip_mvsearch_last/gf frame flags.
  // This is to skip searching mv for that reference if it was last
  // refreshed (i.e., buffer slot holding that reference was refreshed) on the
  // previous spatial layer(s) at the same time (current_superframe).
  if (rtc_ref->set_ref_frame_config && svc->force_zero_mode_spatial_ref &&
      cpi->sf.rt_sf.use_nonrd_pick_mode) {
    if (av1_check_ref_is_low_spatial_res_super_frame(cpi, LAST_FRAME)) {
      svc->skip_mvsearch_last = 1;
    }
    if (av1_check_ref_is_low_spatial_res_super_frame(cpi, GOLDEN_FRAME)) {
      svc->skip_mvsearch_gf = 1;
    }
    if (av1_check_ref_is_low_spatial_res_super_frame(cpi, ALTREF_FRAME)) {
      svc->skip_mvsearch_altref = 1;
    }
  }
}